

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

int fit_line(lsfit_acc *a,int fits,int *y0,int *y1,vorbis_info_floor1 *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = a->x0;
  if (fits < 1) {
    dVar9 = 0.0;
    dVar5 = 0.0;
    dVar10 = 0.0;
    dVar7 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    lVar4 = 0;
    dVar7 = 0.0;
    dVar10 = 0.0;
    dVar5 = 0.0;
    dVar9 = 0.0;
    do {
      iVar1 = *(int *)((long)&a->an + lVar4);
      iVar2 = *(int *)((long)&a->bn + lVar4);
      dVar8 = (double)(((float)(iVar1 + iVar2) * info->twofitweight) / (float)(iVar1 + 1)) + 1.0;
      dVar6 = dVar6 + (double)*(int *)((long)&a->xa + lVar4) * dVar8 +
                      (double)*(int *)((long)&a->xb + lVar4);
      dVar7 = dVar7 + (double)*(int *)((long)&a->ya + lVar4) * dVar8 +
                      (double)*(int *)((long)&a->yb + lVar4);
      dVar10 = dVar10 + (double)*(int *)((long)&a->x2a + lVar4) * dVar8 +
                        (double)*(int *)((long)&a->x2b + lVar4);
      dVar5 = dVar5 + (double)*(int *)((long)&a->xya + lVar4) * dVar8 +
                      (double)*(int *)((long)&a->xyb + lVar4);
      dVar9 = dVar9 + (double)iVar1 * dVar8 + (double)iVar2;
      lVar4 = lVar4 + 0x38;
    } while ((ulong)(uint)fits * 0x38 - lVar4 != 0);
  }
  iVar1 = a[(long)fits + -1].x1;
  iVar2 = *y0;
  if (-1 < iVar2) {
    dVar7 = dVar7 + (double)iVar2;
    dVar10 = dVar10 + (double)(iVar3 * iVar3);
    dVar6 = dVar6 + (double)iVar3;
    dVar5 = dVar5 + (double)(iVar2 * iVar3);
    dVar9 = dVar9 + 1.0;
  }
  iVar2 = *y1;
  if (-1 < iVar2) {
    dVar7 = dVar7 + (double)iVar2;
    dVar10 = dVar10 + (double)(iVar1 * iVar1);
    dVar6 = dVar6 + (double)iVar1;
    dVar5 = dVar5 + (double)(iVar2 * iVar1);
    dVar9 = dVar9 + 1.0;
  }
  dVar8 = dVar9 * dVar10 - dVar6 * dVar6;
  if (dVar8 <= 0.0) {
    *y0 = 0;
    iVar3 = 1;
  }
  else {
    dVar10 = (dVar10 * dVar7 - dVar6 * dVar5) / dVar8;
    dVar8 = (dVar9 * dVar5 + -dVar6 * dVar7) / dVar8;
    dVar5 = rint((double)iVar3 * dVar8 + dVar10);
    *y0 = (int)dVar5;
    dVar5 = rint(dVar8 * (double)iVar1 + dVar10);
    *y1 = (int)dVar5;
    if (0x3ff < *y0) {
      *y0 = 0x3ff;
    }
    if (0x3ff < *y1) {
      *y1 = 0x3ff;
    }
    if (*y0 < 0) {
      *y0 = 0;
    }
    iVar3 = 0;
    if (-1 < *y1) {
      return 0;
    }
  }
  *y1 = 0;
  return iVar3;
}

Assistant:

static int fit_line(lsfit_acc *a,int fits,int *y0,int *y1,
                    vorbis_info_floor1 *info){
  double xb=0,yb=0,x2b=0,y2b=0,xyb=0,bn=0;
  int i;
  int x0=a[0].x0;
  int x1=a[fits-1].x1;

  for(i=0;i<fits;i++){
    double weight = (a[i].bn+a[i].an)*info->twofitweight/(a[i].an+1)+1.;

    xb+=a[i].xb + a[i].xa * weight;
    yb+=a[i].yb + a[i].ya * weight;
    x2b+=a[i].x2b + a[i].x2a * weight;
    y2b+=a[i].y2b + a[i].y2a * weight;
    xyb+=a[i].xyb + a[i].xya * weight;
    bn+=a[i].bn + a[i].an * weight;
  }

  if(*y0>=0){
    xb+=   x0;
    yb+=  *y0;
    x2b+=  x0 *  x0;
    y2b+= *y0 * *y0;
    xyb+= *y0 *  x0;
    bn++;
  }

  if(*y1>=0){
    xb+=   x1;
    yb+=  *y1;
    x2b+=  x1 *  x1;
    y2b+= *y1 * *y1;
    xyb+= *y1 *  x1;
    bn++;
  }

  {
    double denom=(bn*x2b-xb*xb);

    if(denom>0.){
      double a=(yb*x2b-xyb*xb)/denom;
      double b=(bn*xyb-xb*yb)/denom;
      *y0=rint(a+b*x0);
      *y1=rint(a+b*x1);

      /* limit to our range! */
      if(*y0>1023)*y0=1023;
      if(*y1>1023)*y1=1023;
      if(*y0<0)*y0=0;
      if(*y1<0)*y1=0;

      return 0;
    }else{
      *y0=0;
      *y1=0;
      return 1;
    }
  }
}